

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
static_resources(static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *this,custom_functions<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *functions,allocator_type *alloc)

{
  bool bVar1;
  const_iterator __args;
  reference this_00;
  string_type *__args_1;
  function_type *this_01;
  undefined8 in_RSI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_false,_false>,_bool>
  pVar2;
  custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *item;
  const_iterator __end0;
  const_iterator __begin0;
  custom_functions<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *__range3;
  allocator_type *in_stack_000005f8;
  static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000600;
  custom_functions<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_false>
  in_stack_ffffffffffffff48;
  __normal_iterator<const_jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  static_resources(in_stack_00000600,in_stack_000005f8);
  local_20 = local_10;
  local_28._M_current =
       (custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)custom_functions<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::begin(in_stack_ffffffffffffff38);
  __args = custom_functions<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       (__normal_iterator<const_jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
              ::operator*(&local_28);
    __args_1 = custom_function<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
               ::name_abi_cxx11_((custom_function<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
                                  *)this_00);
    custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::arity(this_00);
    this_01 = custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::function(this_00);
    std::
    make_unique<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::optional<unsigned_long>,std::function<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::detail::span<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>const,18446744073709551615ul>,std::error_code&)>const&>
              ((optional<unsigned_long> *)__args._M_current,
               (function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_std::error_code_&)>
                *)__args_1);
    pVar2 = std::
            unordered_map<std::__cxx11::wstring,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>>>>
            ::
            emplace<std::__cxx11::wstring_const&,std::unique_ptr<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>>
                      ((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::MyHash,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>_>
                        *)this_01,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )in_stack_ffffffffffffff48._M_cur,
                       (unique_ptr<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff48._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_false>
         ._M_cur;
    in_stack_ffffffffffffff47 = pVar2.second;
    std::
    unique_ptr<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~unique_ptr((unique_ptr<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    __gnu_cxx::
    __normal_iterator<const_jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

static_resources(const custom_functions<Json>& functions, 
            const allocator_type& alloc = allocator_type())
            : static_resources(alloc)
        {
            for (const auto& item : functions)
            {
                custom_functions_.emplace(item.name(),
                                          jsoncons::make_unique<decorator_function<Json>>(item.arity(),item.function()));
            }
        }